

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O3

bool __thiscall
cmListFileParser::AddArgument(cmListFileParser *this,cmListFileLexer_Token *token,Delimiter delim)

{
  cmMessenger *this_00;
  undefined8 this_01;
  undefined8 uVar1;
  ostream *poVar2;
  bool bVar3;
  char *pcVar4;
  bool bVar5;
  bool bVar6;
  cmListFileContext lfc;
  ostringstream m;
  undefined1 local_228 [32];
  element_type local_208;
  long local_1b0;
  undefined1 local_1a8 [376];
  
  local_208.field_0.Bottom.Position.Position._4_4_ = delim;
  std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
  emplace_back<char*&,cmListFileArgument::Delimiter&,int&>
            ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)
             &(this->Function).Arguments,&token->text,(Delimiter *)((long)&local_208.field_0 + 0x14)
             ,&token->line);
  if (this->Separation == SeparationOkay) {
    bVar3 = true;
  }
  else {
    bVar5 = this->Separation != SeparationError;
    bVar6 = local_208.field_0._20_4_ != Bracket;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    local_208.field_0._24_8_ = (long)&local_208.field_0 + 0x28;
    local_208.field_0.Context.FilePath._M_dataplus._M_p = (_Alloc_hider)(pointer)0x0;
    local_208.field_0.Context.FilePath._M_string_length._0_1_ = 0;
    local_208.field_0._56_8_ = &local_208.Parent;
    local_208.field_0.Context.Line = 0;
    local_208.Parent.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ =
         0;
    local_1b0 = 0;
    pcVar4 = this->FileName;
    strlen(pcVar4);
    std::__cxx11::string::_M_replace
              ((ulong)((long)&local_208.field_0 + 0x38),0,(char *)0x0,(ulong)pcVar4);
    local_1b0 = (long)token->line;
    local_228._0_8_ =
         (this->Backtrace).TopEntry.
         super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_228._8_8_ =
         (this->Backtrace).TopEntry.
         super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_)->_M_use_count + 1;
      }
    }
    cmListFileBacktrace::Push
              ((cmListFileBacktrace *)(local_228 + 0x10),(cmListFileContext *)local_228);
    uVar1 = local_228._24_8_;
    local_228._0_8_ = local_228._16_8_;
    this_01 = local_228._8_8_;
    local_228._16_8_ = (element_type *)0x0;
    local_228._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_228._8_8_ = uVar1;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._24_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._24_8_);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Syntax ",7);
    bVar3 = bVar5 && bVar6;
    pcVar4 = "Error";
    if (bVar5 && bVar6) {
      pcVar4 = "Warning";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,pcVar4,(ulong)bVar3 * 2 + 5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8," in cmake code at ",0x12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"column ",7);
    poVar2 = (ostream *)std::ostream::operator<<(local_1a8,token->column);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"Argument not separated from preceding token by whitespace.",0x3a);
    this_00 = this->Messenger;
    if (bVar5 && bVar6) {
      std::__cxx11::stringbuf::str();
      cmMessenger::IssueMessage
                (this_00,AUTHOR_WARNING,(string *)(local_228 + 0x10),
                 (cmListFileBacktrace *)local_228);
    }
    else {
      std::__cxx11::stringbuf::str();
      cmMessenger::IssueMessage
                (this_00,FATAL_ERROR,(string *)(local_228 + 0x10),(cmListFileBacktrace *)local_228);
    }
    if ((element_type *)local_228._16_8_ != &local_208) {
      operator_delete((void *)local_228._16_8_,
                      (ulong)&((local_208.field_0.Bottom.State)->PropertyDefinitions)._M_t._M_impl.
                              field_0x1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_);
    }
    if ((shared_ptr<const_cmListFileBacktrace::Entry> *)local_208.field_0._56_8_ !=
        &local_208.Parent) {
      operator_delete((void *)local_208.field_0._56_8_,
                      CONCAT71(local_208.Parent.
                               super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr._1_7_,
                               local_208.Parent.
                               super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr._0_1_) + 1);
    }
    if ((undefined1 *)local_208.field_0._24_8_ != (undefined1 *)((long)&local_208.field_0 + 0x28)) {
      operator_delete((void *)local_208.field_0._24_8_,
                      CONCAT71(local_208.field_0.Context.FilePath._M_string_length._1_7_,
                               local_208.field_0.Context.FilePath._M_string_length._0_1_) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  }
  return bVar3;
}

Assistant:

bool cmListFileParser::AddArgument(cmListFileLexer_Token* token,
                                   cmListFileArgument::Delimiter delim)
{
  this->Function.Arguments.emplace_back(token->text, delim, token->line);
  if (this->Separation == SeparationOkay) {
    return true;
  }
  bool isError = (this->Separation == SeparationError ||
                  delim == cmListFileArgument::Bracket);
  std::ostringstream m;
  cmListFileContext lfc;
  lfc.FilePath = this->FileName;
  lfc.Line = token->line;
  cmListFileBacktrace lfbt = this->Backtrace;
  lfbt = lfbt.Push(lfc);

  m << "Syntax " << (isError ? "Error" : "Warning") << " in cmake code at "
    << "column " << token->column << "\n"
    << "Argument not separated from preceding token by whitespace.";
  /* clang-format on */
  if (isError) {
    this->Messenger->IssueMessage(MessageType::FATAL_ERROR, m.str(), lfbt);
    return false;
  }
  this->Messenger->IssueMessage(MessageType::AUTHOR_WARNING, m.str(), lfbt);
  return true;
}